

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O1

void __thiscall Lodtalk::StackMemory::useNewPageFor(StackMemory *this,uint8_t *framePointer)

{
  pointer *pppSVar1;
  StackPage *pSVar2;
  StackPage *pSVar3;
  StackPage *pSVar4;
  iterator __position;
  
  pSVar2 = (this->stackPages).
           super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(ulong)((long)framePointer - (long)this->stackMemoryLowest) >> 0xd];
  if (pSVar2->baseFramePointer != (uint8_t *)0x0) {
    pSVar3 = this->currentPage;
    if (pSVar3 != (StackPage *)0x0) {
      pSVar3->baseFramePointer = (uint8_t *)0x0;
      (pSVar3->headFrame).framePointer = (uint8_t *)0x0;
      (pSVar3->headFrame).stackPointer = (uint8_t *)0x0;
      pSVar4 = pSVar3->previousPage;
      if (pSVar4 != (StackPage *)0x0) {
        pSVar4->nextPage = pSVar3->nextPage;
      }
      if (pSVar3->nextPage != (StackPage *)0x0) {
        pSVar3->nextPage->previousPage = pSVar4;
      }
      pSVar3->previousPage = (StackPage *)0x0;
      pSVar3->nextPage = (StackPage *)0x0;
      __position._M_current =
           (this->freePages).
           super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->freePages).
          super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>>::
        _M_realloc_insert<Lodtalk::StackPage*const&>
                  ((vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>> *)
                   &this->freePages,__position,&this->currentPage);
      }
      else {
        *__position._M_current = this->currentPage;
        pppSVar1 = &(this->freePages).
                    super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    this->currentPage = pSVar2;
    return;
  }
  __assert_fail("newPage->isInUse()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x10d,"void Lodtalk::StackMemory::useNewPageFor(uint8_t *)");
}

Assistant:

size_t StackMemory::getPageIndexFor(uint8_t *pointer)
{
    return (pointer - stackMemoryLowest) / StackMemoryPageSize;
}